

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCMTrack.cpp
# Opt level: O3

PCMTrack * __thiscall Storage::Disk::PCMTrack::resampled_clone(PCMTrack *this,size_t bits_per_track)

{
  pointer pPVar1;
  PCMTrack *this_00;
  PCMSegment *segment;
  ulong uVar2;
  unsigned_long uVar3;
  ulong uVar4;
  ulong __m;
  uint uVar5;
  _Ct __n2;
  ulong __n;
  uint uVar6;
  _Ct __m2;
  PCMSegmentEventSource *event_source;
  pointer this_01;
  Time start_time;
  Time local_40;
  Time local_38;
  
  this_00 = (PCMTrack *)operator_new(0x30);
  PCMTrack(this_00,(uint)bits_per_track);
  local_40.length = 0;
  local_40.clock_rate = 1;
  this_01 = (this->segment_event_sources_).
            super__Vector_base<Storage::Disk::PCMSegmentEventSource,_std::allocator<Storage::Disk::PCMSegmentEventSource>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (this->segment_event_sources_).
           super__Vector_base<Storage::Disk::PCMSegmentEventSource,_std::allocator<Storage::Disk::PCMSegmentEventSource>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_01 == pPVar1) {
LAB_00443ee9:
    this_00->is_resampled_clone_ = true;
    return this_00;
  }
  __m = 0;
  __n = 1;
LAB_00443d6d:
  segment = PCMSegmentEventSource::segment(this_01);
  add_segment(this_00,&local_40,segment,true);
  Time::Time(&local_38,
             (ulong)((*(int *)&(segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                     *(int *)&(segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
                    (segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset) *
             (ulong)(segment->length_of_a_bit).length,(ulong)(segment->length_of_a_bit).clock_rate);
  uVar4 = (ulong)local_38 & 0xffffffff;
  if (uVar4 != 0) {
    uVar2 = (ulong)local_38 >> 0x20;
    if ((int)__m == 0) {
      local_40 = local_38;
      __m = (ulong)local_38 & 0xffffffff;
      __n = uVar2;
      goto LAB_00443ed9;
    }
    if ((uint)__n == local_38.clock_rate) {
      __m = uVar4 + (__m & 0xffffffff);
    }
    else {
      __m = uVar4 * __n + (__m & 0xffffffff) * uVar2;
      __n = __n * uVar2;
    }
    if ((__n | __m) >> 0x20 == 0) {
LAB_00443e61:
      local_40.length = (uint)__m;
      __n = __n & 0xffffffff;
    }
    else {
      if (__m != 0) {
        uVar4 = __m;
        if (((__n | __m) & 0xf) == 0) {
          do {
            __m = uVar4 >> 4;
            uVar5 = (uint)__n;
            uVar6 = (uint)uVar4;
            __n = __n >> 4;
            uVar4 = __m;
          } while (((uVar6 | uVar5) & 0xf0) == 0);
        }
        uVar5 = ((uint)__m | (uint)__n) & 1;
        while (uVar5 == 0) {
          uVar5 = (uint)__n;
          __n = __n >> 1;
          uVar5 = ((uint)__m | uVar5) & 2;
          __m = __m >> 1;
        }
        if ((__m >> 0x20 != 0) || (__n >> 0x20 != 0)) {
          uVar3 = std::__detail::__gcd<unsigned_long>(__m,__n);
          __m = __m / uVar3;
          __n = __n / uVar3;
          do {
            if (__m >> 0x20 == 0) {
              if (__n >> 0x20 == 0) break;
            }
            else if (__n < 2) goto LAB_00443ec2;
            __m = __m >> 1;
            __n = __n >> 1;
          } while( true );
        }
        goto LAB_00443e61;
      }
      local_40.length = 0;
      __n = 1;
      __m = 0;
    }
    goto LAB_00443ed5;
  }
  goto LAB_00443ed9;
LAB_00443ec2:
  local_40.length = 0xffffffff;
  __n = 1;
  __m = 0xffffffff;
LAB_00443ed5:
  local_40.clock_rate = (uint)__n;
LAB_00443ed9:
  this_01 = this_01 + 1;
  if (this_01 == pPVar1) goto LAB_00443ee9;
  goto LAB_00443d6d;
}

Assistant:

PCMTrack *PCMTrack::resampled_clone(size_t bits_per_track) {
	// Create an empty track.
	PCMTrack *const new_track = new PCMTrack(unsigned(bits_per_track));

	// Plot all segments from this track onto the destination.
	Time start_time;
	for(const auto &event_source: segment_event_sources_) {
		const PCMSegment &source = event_source.segment();
		new_track->add_segment(start_time, source, true);
		start_time += source.length();
	}

	new_track->is_resampled_clone_ = true;
	return new_track;
}